

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void failure_rate_binary_fuse16(void)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  uint64_t *keys;
  size_t trial;
  long lVar4;
  size_t i;
  long lVar5;
  long lVar6;
  binary_fuse16_t filter;
  binary_fuse16_t bStack_58;
  
  puts("testing binary fuse16 for failure rate");
  keys = (uint64_t *)malloc(40000);
  binary_fuse16_allocate(5000,&bStack_58);
  lVar6 = 0;
  for (lVar4 = 0; lVar4 != 0x3e9; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 != 5000; lVar5 = lVar5 + 1) {
      iVar2 = rand();
      uVar3 = rand();
      keys[lVar5] = ((ulong)uVar3 << 0x20) + (long)iVar2;
    }
    _Var1 = binary_fuse16_populate(keys,5000,&bStack_58);
    lVar6 = lVar6 + (ulong)!_Var1;
  }
  printf("failures %zu out of %zu\n\n",lVar6,1000000);
  binary_fuse16_free(&bStack_58);
  free(keys);
  return;
}

Assistant:

void failure_rate_binary_fuse16() {
  printf("testing binary fuse16 for failure rate\n");
  // we construct many 5000-long input cases and check the probability of failure.
  size_t size = 5000;
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  binary_fuse16_t filter;
  binary_fuse16_allocate((uint32_t)size, &filter);
  size_t failure = 0;
  size_t total_trials = 1000000;

  for(size_t trial = 0; trial <= 1000; trial++) {
    for (size_t i = 0; i < size; i++) {
      big_set[i] = (uint64_t)rand() + (((uint64_t) rand()) << 32U);
    }
    if(!binary_fuse16_populate(big_set, (uint32_t)size, &filter)) {
      failure++;
    }
  }
  printf("failures %zu out of %zu\n\n", failure, total_trials);
  binary_fuse16_free(&filter);
  free(big_set);
}